

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

bool headerNameValidImpl(QLatin1StringView name)

{
  _Iter_negate<__7> *p_Var1;
  bool bVar2;
  _Iter_negate<__7> *this;
  _Iter_negate<__7> *__it;
  long lVar3;
  long lVar4;
  _Iter_negate<__7> *p_Var5;
  
  this = (_Iter_negate<__7> *)name.m_data;
  lVar4 = name.m_size;
  p_Var1 = this + lVar4;
  __it = this;
  for (lVar3 = lVar4 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this,(char *)__it);
    p_Var5 = this;
    if (bVar2) goto LAB_0018691e;
    bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this + 1,(char *)__it);
    p_Var5 = this + 1;
    if (bVar2) goto LAB_0018691e;
    bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this + 2,(char *)__it);
    p_Var5 = this + 2;
    if (bVar2) goto LAB_0018691e;
    bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this + 3,(char *)__it);
    p_Var5 = this + 3;
    if (bVar2) goto LAB_0018691e;
    this = this + 4;
    lVar4 = lVar4 + -4;
  }
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      p_Var5 = p_Var1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this,(char *)__it), p_Var5 = this,
         bVar2)) goto LAB_0018691e;
      this = this + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this,(char *)__it);
    p_Var5 = this;
    if (bVar2) goto LAB_0018691e;
    this = this + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this,(char *)__it);
  p_Var5 = this;
  if (!bVar2) {
    p_Var5 = p_Var1;
  }
LAB_0018691e:
  return p_Var5 == p_Var1;
}

Assistant:

static bool headerNameValidImpl(QLatin1StringView name) noexcept
{
    return std::all_of(name.begin(), name.end(), isValidHttpHeaderNameChar);
}